

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_misc.h
# Opt level: O2

void * mbedtls_ssl_get_sig_algs(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  uint16_t *puVar2;
  
  pmVar1 = ssl->handshake;
  if (((pmVar1 == (mbedtls_ssl_handshake_params *)0x0) ||
      (pmVar1->sig_algs_heap_allocated != '\x01')) ||
     (puVar2 = pmVar1->sig_algs, puVar2 == (uint16_t *)0x0)) {
    puVar2 = ssl->conf->sig_algs;
  }
  return puVar2;
}

Assistant:

static inline const void *mbedtls_ssl_get_sig_algs(
    const mbedtls_ssl_context *ssl)
{
#if defined(MBEDTLS_SSL_HANDSHAKE_WITH_CERT_ENABLED)

#if !defined(MBEDTLS_DEPRECATED_REMOVED)
    if (ssl->handshake != NULL &&
        ssl->handshake->sig_algs_heap_allocated == 1 &&
        ssl->handshake->sig_algs != NULL) {
        return ssl->handshake->sig_algs;
    }
#endif
    return ssl->conf->sig_algs;

#else /* MBEDTLS_SSL_HANDSHAKE_WITH_CERT_ENABLED */

    ((void) ssl);
    return NULL;
#endif /* MBEDTLS_SSL_HANDSHAKE_WITH_CERT_ENABLED */
}